

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load_entries<setup::file_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::file_entry,_std::allocator<setup::file_entry>_> *result,enum_type entry_type
          )

{
  _Base_bitset<1UL> _Var1;
  long lVar2;
  bool bVar3;
  file_entry entry;
  flags<setup::info::entry_types_Enum_,_21UL> local_228;
  file_entry local_220;
  
  local_228._flags.super__Base_bitset<1UL>._M_w = entries._flags.super__Base_bitset<1UL>._M_w;
  std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>::clear(result);
  _Var1._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&(&local_228,entry_type)
  ;
  if ((_Base_bitset<1UL>)_Var1._M_w == (_Base_bitset<1UL>)0x0) {
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      file_entry::file_entry(&local_220);
      file_entry::load(&local_220,is,this);
      file_entry::~file_entry(&local_220);
    }
  }
  else {
    std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>::resize(result,count);
    lVar2 = 0;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      file_entry::load((file_entry *)
                       ((long)&(((result->
                                 super__Vector_base<setup::file_entry,_std::allocator<setup::file_entry>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->super_item).components
                               ._M_dataplus + lVar2),is,this);
      lVar2 = lVar2 + 0x1f0;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}